

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::Coroutine<kj::HttpInputStream::Response>::fulfill
          (Coroutine<kj::HttpInputStream::Response> *this,
          FixVoid<kj::HttpInputStream::Response> *value)

{
  undefined8 uVar1;
  ExceptionOr<kj::HttpInputStream::Response> local_1d8;
  
  if ((this->super_CoroutineBase).waiting == true) {
    local_1d8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1d8.value.ptr.isSet = true;
    local_1d8.value.ptr.field_1._0_8_ = *(undefined8 *)value;
    local_1d8.value.ptr.field_1.value.statusText.content.ptr = (value->statusText).content.ptr;
    local_1d8.value.ptr.field_1.value.statusText.content.size_ = (value->statusText).content.size_;
    local_1d8.value.ptr.field_1.value.headers = value->headers;
    local_1d8.value.ptr.field_1.value.body.disposer = (value->body).disposer;
    local_1d8.value.ptr.field_1.value.body.ptr = (value->body).ptr;
    (value->body).ptr = (AsyncInputStream *)0x0;
    ExceptionOr<kj::HttpInputStream::Response>::operator=(&this->result,&local_1d8);
    uVar1 = local_1d8.value.ptr.field_1.value.body.ptr;
    if ((local_1d8.value.ptr.isSet == true) &&
       (local_1d8.value.ptr.field_1.value.body.ptr != (AsyncInputStream *)0x0)) {
      local_1d8.value.ptr.field_1.value.body.ptr = (AsyncInputStream *)0x0;
      (**(local_1d8.value.ptr.field_1.value.body.disposer)->_vptr_Disposer)
                (local_1d8.value.ptr.field_1.value.body.disposer,
                 (_func_int *)
                 ((long)&((AsyncInputStream *)uVar1)->_vptr_AsyncInputStream +
                 (long)((AsyncInputStream *)uVar1)->_vptr_AsyncInputStream[-2]));
    }
    if (local_1d8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1d8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_CoroutineBase).onReadyEvent);
    (this->super_CoroutineBase).waiting = false;
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }